

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPoint2PointConstraint.cpp
# Opt level: O1

void __thiscall btPoint2PointConstraint::buildJacobian(btPoint2PointConstraint *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  btRigidBody *pbVar6;
  btRigidBody *pbVar7;
  int i;
  long lVar8;
  btJacobianEntry *this_00;
  float fVar9;
  float fVar10;
  btMatrix3x3 local_c8;
  btMatrix3x3 local_98;
  btVector3 local_68;
  btVector3 local_50;
  btVector3 local_40;
  
  (this->super_btTypedConstraint).m_appliedImpulse = 0.0;
  this_00 = this->m_jac;
  local_68.m_floats[0] = 0.0;
  local_68.m_floats[1] = 0.0;
  local_68.m_floats[2] = 0.0;
  local_68.m_floats[3] = 0.0;
  lVar8 = 0;
  do {
    local_68.m_floats[lVar8] = 1.0;
    pbVar6 = (this->super_btTypedConstraint).m_rbA;
    local_98.m_el[0].m_floats[0] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
    local_98.m_el[0].m_floats[1] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
    local_98.m_el[0].m_floats[2] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
    local_98.m_el[0].m_floats[3] = 0.0;
    local_98.m_el[1].m_floats[0] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
    local_98.m_el[1].m_floats[1] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
    local_98.m_el[1].m_floats[2] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
    local_98.m_el[1].m_floats[3] = 0.0;
    local_98.m_el[2].m_floats[0] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
    local_98.m_el[2].m_floats[1] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
    local_98.m_el[2].m_floats[2] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
    local_98.m_el[2].m_floats[3] = 0.0;
    pbVar7 = (this->super_btTypedConstraint).m_rbB;
    local_c8.m_el[0].m_floats[0] =
         (pbVar7->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
    local_c8.m_el[0].m_floats[1] =
         (pbVar7->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
    local_c8.m_el[0].m_floats[2] =
         (pbVar7->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
    local_c8.m_el[0].m_floats[3] = 0.0;
    local_c8.m_el[1].m_floats[0] =
         (pbVar7->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
    local_c8.m_el[1].m_floats[1] =
         (pbVar7->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
    local_c8.m_el[1].m_floats[2] =
         (pbVar7->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
    local_c8.m_el[1].m_floats[3] = 0.0;
    local_c8.m_el[2].m_floats[0] =
         (pbVar7->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
    local_c8.m_el[2].m_floats[1] =
         (pbVar7->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
    local_c8.m_el[2].m_floats[2] =
         (pbVar7->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
    local_c8.m_el[2].m_floats[3] = 0.0;
    fVar1 = (this->m_pivotInA).m_floats[0];
    fVar2 = (this->m_pivotInA).m_floats[1];
    fVar3 = (this->m_pivotInA).m_floats[2];
    fVar4 = (pbVar6->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
    uVar5 = *(undefined8 *)(pbVar6->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
    fVar9 = (float)uVar5;
    fVar10 = (float)((ulong)uVar5 >> 0x20);
    local_40.m_floats[1] =
         ((pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2] * fVar3 +
          fVar1 * (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0] +
          (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1] * fVar2 +
         fVar10) - fVar10;
    local_40.m_floats[0] =
         ((pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2] * fVar3 +
          fVar1 * (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0] +
          (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1] * fVar2 +
         fVar9) - fVar9;
    local_40.m_floats[2] =
         (local_98.m_el[2].m_floats[2] * fVar3 +
          (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0] * fVar1 +
          (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1] * fVar2 +
         fVar4) - fVar4;
    local_40.m_floats[3] = 0.0;
    fVar1 = (this->m_pivotInB).m_floats[0];
    fVar2 = (this->m_pivotInB).m_floats[1];
    fVar3 = (this->m_pivotInB).m_floats[2];
    fVar4 = (pbVar7->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
    uVar5 = *(undefined8 *)(pbVar7->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
    fVar9 = (float)uVar5;
    fVar10 = (float)((ulong)uVar5 >> 0x20);
    local_50.m_floats[1] =
         ((pbVar7->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2] * fVar3 +
          fVar1 * (pbVar7->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0] +
          (pbVar7->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1] * fVar2 +
         fVar10) - fVar10;
    local_50.m_floats[0] =
         ((pbVar7->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2] * fVar3 +
          fVar1 * (pbVar7->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0] +
          (pbVar7->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1] * fVar2 +
         fVar9) - fVar9;
    local_50.m_floats[2] =
         (local_c8.m_el[2].m_floats[2] * fVar3 +
          (pbVar7->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0] * fVar1 +
          (pbVar7->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1] * fVar2 +
         fVar4) - fVar4;
    local_50.m_floats[3] = 0.0;
    btJacobianEntry::btJacobianEntry
              (this_00,&local_98,&local_c8,&local_40,&local_50,&local_68,&pbVar6->m_invInertiaLocal,
               pbVar6->m_inverseMass,&pbVar7->m_invInertiaLocal,pbVar7->m_inverseMass);
    local_68.m_floats[lVar8] = 0.0;
    lVar8 = lVar8 + 1;
    this_00 = this_00 + 1;
  } while (lVar8 != 3);
  return;
}

Assistant:

void	btPoint2PointConstraint::buildJacobian()
{

	///we need it for both methods
	{
		m_appliedImpulse = btScalar(0.);

		btVector3	normal(0,0,0);

		for (int i=0;i<3;i++)
		{
			normal[i] = 1;
			new (&m_jac[i]) btJacobianEntry(
			m_rbA.getCenterOfMassTransform().getBasis().transpose(),
			m_rbB.getCenterOfMassTransform().getBasis().transpose(),
			m_rbA.getCenterOfMassTransform()*m_pivotInA - m_rbA.getCenterOfMassPosition(),
			m_rbB.getCenterOfMassTransform()*m_pivotInB - m_rbB.getCenterOfMassPosition(),
			normal,
			m_rbA.getInvInertiaDiagLocal(),
			m_rbA.getInvMass(),
			m_rbB.getInvInertiaDiagLocal(),
			m_rbB.getInvMass());
		normal[i] = 0;
		}
	}


}